

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

uint64_t __thiscall pstore::file::file_handle::size(file_handle *this)

{
  int iVar1;
  int *piVar2;
  stat buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  stat local_a8;
  
  ensure_open(this);
  memset(&local_a8,0,0x90);
  iVar1 = fstat(this->file_,&local_a8);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    std::__cxx11::string::string((string *)&bStack_c8,(string *)&this->path_);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (iVar1,"fstat failed",&bStack_c8);
  }
  if (-1 < local_a8.st_size) {
    return local_a8.st_size;
  }
  assert_failed("buf.st_size >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file_posix.cpp"
                ,0x150);
}

Assistant:

std::uint64_t file_handle::size () {
            this->ensure_open ();
            struct stat buf {};
            if (::fstat (file_, &buf) == -1) {
                int const err = errno;
                raise_file_error (err, "fstat failed", this->path ());
            }

            static_assert (std::numeric_limits<std::uint64_t>::max () >=
                               unsigned_cast (std::numeric_limits<decltype (buf.st_size)>::max ()),
                           "stat.st_size is too large for uint64_t");
            PSTORE_ASSERT (buf.st_size >= 0);
            return static_cast<std::uint64_t> (buf.st_size);
        }